

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_sx_w8_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  ulong uVar1;
  undefined8 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar12 = _DAT_00514f60;
  auVar11 = _DAT_00514a80;
  do {
    auVar13 = pshufb(*(undefined1 (*) [16])mask,auVar12);
    auVar14[0] = pavgb(auVar13[8],auVar13[0]);
    cVar15 = pavgb(auVar13[9],auVar13[1]);
    cVar16 = pavgb(auVar13[10],auVar13[2]);
    cVar17 = pavgb(auVar13[0xb],auVar13[3]);
    cVar18 = pavgb(auVar13[0xc],auVar13[4]);
    cVar19 = pavgb(auVar13[0xd],auVar13[5]);
    cVar20 = pavgb(auVar13[0xe],auVar13[6]);
    cVar21 = pavgb(auVar13[0xf],auVar13[7]);
    pavgb(auVar13[8],auVar13[0]);
    pavgb(auVar13[9],auVar13[1]);
    pavgb(auVar13[10],auVar13[2]);
    pavgb(auVar13[0xb],auVar13[3]);
    pavgb(auVar13[0xc],auVar13[4]);
    pavgb(auVar13[0xd],auVar13[5]);
    pavgb(auVar13[0xe],auVar13[6]);
    pavgb(auVar13[0xf],auVar13[7]);
    uVar1 = *(ulong *)src0;
    uVar2 = *(undefined8 *)src1;
    auVar28._8_6_ = 0;
    auVar28._0_8_ = uVar1;
    auVar28[0xe] = (char)(uVar1 >> 0x38);
    auVar28[0xf] = (char)((ulong)uVar2 >> 0x38);
    auVar27._14_2_ = auVar28._14_2_;
    auVar27._8_5_ = 0;
    auVar27._0_8_ = uVar1;
    auVar27[0xd] = (char)((ulong)uVar2 >> 0x30);
    auVar26._13_3_ = auVar27._13_3_;
    auVar26._8_4_ = 0;
    auVar26._0_8_ = uVar1;
    auVar26[0xc] = (char)(uVar1 >> 0x30);
    auVar25._12_4_ = auVar26._12_4_;
    auVar25._8_3_ = 0;
    auVar25._0_8_ = uVar1;
    auVar25[0xb] = (char)((ulong)uVar2 >> 0x28);
    auVar24._11_5_ = auVar25._11_5_;
    auVar24._8_2_ = 0;
    auVar24._0_8_ = uVar1;
    auVar24[10] = (char)(uVar1 >> 0x28);
    auVar23._10_6_ = auVar24._10_6_;
    auVar23[8] = 0;
    auVar23._0_8_ = uVar1;
    auVar23[9] = (char)((ulong)uVar2 >> 0x20);
    auVar22._9_7_ = auVar23._9_7_;
    auVar22[8] = (char)(uVar1 >> 0x20);
    auVar22._0_8_ = uVar1;
    auVar13._8_8_ = auVar22._8_8_;
    auVar13[7] = (char)((ulong)uVar2 >> 0x18);
    auVar13[6] = (char)(uVar1 >> 0x18);
    auVar13[5] = (char)((ulong)uVar2 >> 0x10);
    auVar13[4] = (char)(uVar1 >> 0x10);
    auVar13[3] = (char)((ulong)uVar2 >> 8);
    auVar13[2] = (char)(uVar1 >> 8);
    auVar13[0] = (undefined1)uVar1;
    auVar13[1] = (char)uVar2;
    auVar14._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11('@' - cVar21,cVar21),
                                                                '@' - cVar20),cVar20),'@' - cVar19),
                                     cVar19),'@' - cVar18),CONCAT11(cVar18,cVar21)) >> 8);
    auVar14[7] = '@' - cVar17;
    auVar14[6] = cVar17;
    auVar14[5] = '@' - cVar16;
    auVar14[4] = cVar16;
    auVar14[3] = '@' - cVar15;
    auVar14[2] = cVar15;
    auVar14[1] = '@' - auVar14[0];
    auVar13 = pmaddubsw(auVar13,auVar14);
    auVar13 = pmulhrsw(auVar13,auVar11);
    sVar3 = auVar13._0_2_;
    sVar4 = auVar13._2_2_;
    sVar5 = auVar13._4_2_;
    sVar6 = auVar13._6_2_;
    sVar7 = auVar13._8_2_;
    sVar8 = auVar13._10_2_;
    sVar9 = auVar13._12_2_;
    sVar10 = auVar13._14_2_;
    *(ulong *)dst =
         CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar13[0xe] - (0xff < sVar10),
                  CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar13[0xc] - (0xff < sVar9),
                           CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar13[10] - (0xff < sVar8),
                                    CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar13[8] -
                                             (0xff < sVar7),
                                             CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar13[6] -
                                                      (0xff < sVar6),
                                                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                               auVar13[4] - (0xff < sVar5),
                                                               CONCAT11((0 < sVar4) *
                                                                        (sVar4 < 0x100) * auVar13[2]
                                                                        - (0xff < sVar4),
                                                                        (0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar13[0]
                                                                        - (0xff < sVar3))))))));
    dst = dst + dst_stride;
    src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
    src1 = src1 + src1_stride;
    mask = *(undefined1 (*) [16])mask + mask_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_w8_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  do {
    const __m128i v_r_b = xx_loadu_128(mask);
    const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r_b, v_shuffle_b);
    const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r0_s_b);
    const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_64(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}